

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

int trie_node_append_cb_iterator(trie t,trie_key key,trie_value value,trie_cb_iterate_args args)

{
  int iVar1;
  vector in_RCX;
  trie_key in_RDX;
  trie in_RSI;
  long in_RDI;
  vector unaff_retaddr;
  trie_node_append_iterator_args iterator_args;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((((in_RDI != 0) && (in_RSI != (trie)0x0)) && (in_RDX != (trie_key)0x0)) &&
     (in_RCX != (vector)0x0)) {
    vector_clear((vector)0x1064e0);
    iVar1 = trie_prefixes(in_RSI,in_RDX,in_RCX);
    if (iVar1 == 0) {
      iVar1 = trie_insert((trie)iterator_args,unaff_retaddr,
                          (trie_value)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
      ;
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int trie_node_append_cb_iterator(trie t, trie_key key, trie_value value, trie_cb_iterate_args args)
{
	if (t != NULL && key != NULL && value != NULL && args != NULL)
	{
		trie_node_append_iterator_args iterator_args = args;

		vector_clear(iterator_args->prefixes);

		if (trie_prefixes(t, key, iterator_args->prefixes) == 0)
		{
			return trie_insert(iterator_args->dest, iterator_args->prefixes, value);
		}
	}

	return 1;
}